

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O2

int __thiscall
TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::
ClassId(TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
        *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZSkylineNSymStructMatrix",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
          ::ClassId(&this->
                     super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                   );
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZSkylineNSymStructMatrix<TVar,TPar>::ClassId() const{
  return Hash("TPZSkylineNSymStructMatrix") ^
    TPZSkylineStructMatrix<TVar,TPar>::ClassId() << 1;
}